

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O1

void __thiscall raft_functional_common::TestMgr::save_state(TestMgr *this,srv_state *state)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __atomic_base<unsigned_long> _Var2;
  ptr<buffer> buf;
  element_type *local_38;
  __atomic_base<unsigned_long> _Stack_30;
  _Any_data local_20;
  
  nuraft::srv_state::serialize_v1p((srv_state *)&local_20,(size_t)state);
  nuraft::srv_state::deserialize((srv_state *)&local_38,(buffer *)local_20._M_unused._0_8_);
  _Var2._M_i = _Stack_30._M_i;
  peVar1 = local_38;
  local_38 = (element_type *)0x0;
  _Stack_30._M_i = 0;
  this_00 = (this->savedState).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->savedState).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->savedState).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var2._M_i;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_30._M_i !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_30._M_i);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_);
  }
  return;
}

Assistant:

void save_state(const srv_state& state) {
        ptr<buffer> buf = state.serialize();
        savedState = srv_state::deserialize(*buf);
    }